

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O2

int uv__epoll_init(uv_loop_t *loop)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = epoll_create1(0x80000);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if ((*piVar2 == 0x26) || (*piVar2 == 0x16)) {
      iVar1 = epoll_create(0x100);
      if (iVar1 != -1) {
        uv__cloexec(iVar1,1);
        goto LAB_0061ea94;
      }
    }
    loop->backend_fd = -1;
    iVar1 = -*piVar2;
  }
  else {
LAB_0061ea94:
    loop->backend_fd = iVar1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int uv__epoll_init(uv_loop_t* loop) {
  int fd;
  fd = epoll_create1(O_CLOEXEC);

  /* epoll_create1() can fail either because it's not implemented (old kernel)
   * or because it doesn't understand the O_CLOEXEC flag.
   */
  if (fd == -1 && (errno == ENOSYS || errno == EINVAL)) {
    fd = epoll_create(256);

    if (fd != -1)
      uv__cloexec(fd, 1);
  }

  loop->backend_fd = fd;
  if (fd == -1)
    return UV__ERR(errno);

  return 0;
}